

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt-walk.c
# Opt level: O3

ztresult_t
zt_walk(ztstruct_t *metastruct,void *structure,ztregion_t *regions,int nregions,
       ztwalkhandlers_t *walkhandlers,void *opaque)

{
  int iVar1;
  ztarray *pzVar2;
  void *pvVar3;
  void *pvVar4;
  int iVar5;
  ztresult_t zVar6;
  ulong uVar7;
  ulong uVar8;
  ztregion_t *pzVar9;
  size_t sVar10;
  ztfield_t *pzVar11;
  char *pcVar12;
  ztstruct *metastruct_00;
  long lVar13;
  ztuchar_t *pvalue;
  ulong *structure_00;
  
  if (0 < metastruct->nfields) {
    pzVar11 = metastruct->fields;
    do {
      iVar5 = pzVar11->stride;
      if (iVar5 == 0) {
        iVar5 = pzVar11->nelems;
      }
      if (zttype_custom < pzVar11->type) {
        return 0x60;
      }
      structure_00 = (ulong *)(pzVar11->offset + (long)structure);
      switch(pzVar11->type) {
      case zttype_uchar:
        pcVar12 = pzVar11->name;
        iVar1 = pzVar11->nelems;
        goto LAB_001029fa;
      case zttype_ucharptr:
        structure_00 = (ulong *)*structure_00;
        pcVar12 = pzVar11->name;
        iVar1 = pzVar11->nelems;
LAB_001029fa:
        iVar5 = (*walkhandlers->uchar)
                          (pcVar12,(ztuchar_t *)structure_00,(long)iVar1,(long)iVar5,opaque);
        break;
      case zttype_ushort:
        pcVar12 = pzVar11->name;
        iVar1 = pzVar11->nelems;
        goto LAB_001029b8;
      case zttype_ushortptr:
        structure_00 = (ulong *)*structure_00;
        pcVar12 = pzVar11->name;
        iVar1 = pzVar11->nelems;
LAB_001029b8:
        iVar5 = (*walkhandlers->ushort)
                          (pcVar12,(ztushort_t *)structure_00,(long)iVar1,(long)iVar5,opaque);
        break;
      case zttype_uint:
        pcVar12 = pzVar11->name;
        iVar1 = pzVar11->nelems;
        goto LAB_00102a13;
      case zttype_uintptr:
        structure_00 = (ulong *)*structure_00;
        pcVar12 = pzVar11->name;
        iVar1 = pzVar11->nelems;
LAB_00102a13:
        iVar5 = (*walkhandlers->uint)
                          (pcVar12,(ztuint_t *)structure_00,(long)iVar1,(long)iVar5,opaque);
        break;
      case zttype_struct:
        if (pzVar11->nelems != 1) {
          zVar6 = (*walkhandlers->startarray)(pzVar11->name,pzVar11->nelems,opaque);
          if (zVar6 != 0) {
            return zVar6;
          }
          if (0 < pzVar11->nelems) {
            lVar13 = 0;
            do {
              zVar6 = (*walkhandlers->startstruct)((char *)0x0,opaque);
              if (zVar6 != 0) {
                return zVar6;
              }
              zVar6 = zt_walk(pzVar11->metadata,
                              (ulong *)(pzVar11->size * lVar13 + (long)structure_00),regions,
                              nregions,walkhandlers,opaque);
              if (zVar6 != 0) {
                return zVar6;
              }
              zVar6 = (*walkhandlers->endstruct)(opaque);
              if (zVar6 != 0) {
                return zVar6;
              }
              lVar13 = lVar13 + 1;
            } while (lVar13 < pzVar11->nelems);
          }
          goto LAB_00102baa;
        }
        zVar6 = (*walkhandlers->startstruct)(pzVar11->name,opaque);
        if (zVar6 != 0) {
          return zVar6;
        }
        metastruct_00 = pzVar11->metadata;
LAB_00102a45:
        zVar6 = zt_walk(metastruct_00,structure_00,regions,nregions,walkhandlers,opaque);
        if (zVar6 != 0) {
          return zVar6;
        }
        iVar5 = (*walkhandlers->endstruct)(opaque);
        break;
      case zttype_structptr:
        if (pzVar11->nelems == 1) {
          zVar6 = (*walkhandlers->startstruct)(pzVar11->name,opaque);
          if (zVar6 != 0) {
            return zVar6;
          }
          metastruct_00 = pzVar11->metadata;
          structure_00 = (ulong *)*structure_00;
          goto LAB_00102a45;
        }
        zVar6 = (*walkhandlers->startarray)(pzVar11->name,pzVar11->nelems,opaque);
        if (zVar6 != 0) {
          return zVar6;
        }
        if (0 < pzVar11->nelems) {
          lVar13 = 0;
          do {
            zVar6 = (*walkhandlers->startstruct)((char *)0x0,opaque);
            if (zVar6 != 0) {
              return zVar6;
            }
            zVar6 = zt_walk(pzVar11->metadata,(void *)structure_00[lVar13],regions,nregions,
                            walkhandlers,opaque);
            if (zVar6 != 0) {
              return zVar6;
            }
            zVar6 = (*walkhandlers->endstruct)(opaque);
            if (zVar6 != 0) {
              return zVar6;
            }
            lVar13 = lVar13 + 1;
          } while ((int)lVar13 < pzVar11->nelems);
        }
LAB_00102baa:
        zVar6 = (*walkhandlers->endarray)(opaque);
        if (zVar6 != 0) {
          return zVar6;
        }
        goto LAB_00102c3e;
      case zttype_staticarrayidx:
        if (pzVar11->nelems != 1) {
          return 0x90;
        }
        pvVar3 = (void *)*structure_00;
        if (pvVar3 == (void *)0x0) goto LAB_00102c28;
        pzVar2 = pzVar11->array;
        pvVar4 = pzVar2->base;
        uVar8 = (long)pvVar3 - (long)pvVar4;
        if (pvVar3 < pvVar4) {
          return 0x80;
        }
        sVar10 = pzVar2->length;
        if ((void *)((long)pvVar4 + sVar10) <= pvVar3) {
          return 0x80;
        }
        iVar5 = pzVar2->nelems;
LAB_00102c10:
        uVar8 = uVar8 / (sVar10 / (ulong)(long)iVar5);
        goto LAB_00102c2f;
      case zttype_arrayidx:
        if (pzVar11->nelems != 1) {
          return 0x90;
        }
        if (nregions < 1) {
          uVar7 = 0;
        }
        else {
          uVar7 = 0;
          pzVar9 = regions;
          while (pzVar9->id != pzVar11->regionid) {
            uVar7 = uVar7 + 1;
            pzVar9 = pzVar9 + 1;
            if ((uint)nregions == uVar7) {
              return 0x20;
            }
          }
        }
        if ((int)uVar7 == nregions) {
          return 0x20;
        }
        pvVar3 = (void *)*structure_00;
        if (pvVar3 != (void *)0x0) {
          uVar7 = uVar7 & 0xffffffff;
          pvVar4 = regions[uVar7].spec.base;
          uVar8 = (long)pvVar3 - (long)pvVar4;
          if (pvVar3 < pvVar4) {
            return 0x80;
          }
          sVar10 = regions[uVar7].spec.length;
          if ((void *)((long)pvVar4 + sVar10) <= pvVar3) {
            return 0x80;
          }
          iVar5 = regions[uVar7].spec.nelems;
          goto LAB_00102c10;
        }
LAB_00102c28:
        uVar8 = 0xffffffffffffffff;
LAB_00102c2f:
        iVar5 = (*walkhandlers->index)(pzVar11->name,uVar8,opaque);
        break;
      case zttype_version:
        iVar5 = (*walkhandlers->version)(pzVar11->name,(ztversion_t)*structure_00,opaque);
        break;
      case zttype_custom:
        iVar5 = (*walkhandlers->custom)(pzVar11->name,pzVar11->typeidx,structure_00,opaque);
      }
      if (iVar5 != 0) {
        return iVar5;
      }
LAB_00102c3e:
      pzVar11 = pzVar11 + 1;
    } while (pzVar11 < metastruct->fields + metastruct->nfields);
  }
  return 0;
}

Assistant:

ztresult_t zt_walk(const ztstruct_t       *metastruct,
                   const void             *structure,
                   const ztregion_t       *regions,
                   int                     nregions,
                   const ztwalkhandlers_t *walkhandlers,
                   void                   *opaque)
{
  int              rc;
  const ztfield_t *f;

  for (f = &metastruct->fields[0]; f < &metastruct->fields[metastruct->nfields]; f++)
  {
    const void *rawvalue = (const char *) structure + f->offset;
    int         stride   = (f->stride == ZT_NO_STRIDE) ? f->nelems : f->stride;

    switch (f->type)
    {
    case zttype_uchar:
      {
        const ztuchar_t *pvalue = rawvalue;
        rc = walkhandlers->uchar(f->name, pvalue, f->nelems, stride, opaque);
        if (rc)
          return rc;
        break;
      }

    case zttype_ucharptr:
      {
        const ztuchar_t **ppdata = (const ztuchar_t **) rawvalue;
        const ztuchar_t  *pvalue = *ppdata;
        rc = walkhandlers->uchar(f->name, pvalue, f->nelems, stride, opaque);
        if (rc)
          return rc;
        break;
      }

    case zttype_ushort:
      {
        const ztushort_t *pvalue = rawvalue;
        rc = walkhandlers->ushort(f->name, pvalue, f->nelems, stride, opaque);
        if (rc)
          return rc;
        break;
      }

    case zttype_ushortptr:
      {
        const ztushort_t **ppdata = (const ztushort_t **) rawvalue;
        const ztushort_t  *pvalue = *ppdata;
        rc = walkhandlers->ushort(f->name, pvalue, f->nelems, stride, opaque);
        if (rc)
          return rc;
        break;
      }

    case zttype_uint:
      {
        const ztuint_t *pvalue = rawvalue;
        rc = walkhandlers->uint(f->name, pvalue, f->nelems, stride, opaque);
        if (rc)
          return rc;
        break;
      }

    case zttype_uintptr:
      {
        const ztuint_t **ppdata = (const ztuint_t **) rawvalue;
        const ztuint_t  *pvalue = *ppdata;
        rc = walkhandlers->uint(f->name, pvalue, f->nelems, stride, opaque);
        if (rc)
          return rc;
        break;
      }

    case zttype_struct:
      {
        const void *pstruct = rawvalue;

        if (f->nelems == 1)
        {
          rc = walkhandlers->startstruct(f->name, opaque);
          if (rc)
            return rc;

          rc = zt_walk(f->metadata,
                       pstruct,
                       regions,
                       nregions,
                       walkhandlers,
                       opaque);
          if (rc)
            return rc;

          rc = walkhandlers->endstruct(opaque);
          if (rc)
            return rc;
        }
        else
        {
          int i;

          rc = walkhandlers->startarray(f->name, f->nelems, opaque);
          if (rc)
            return rc;

          for (i = 0; i < f->nelems; i++)
          {
            rc = walkhandlers->startstruct(NULL /* name */, opaque);
            if (rc)
              return rc;

            rc = zt_walk(f->metadata,
                         (char *) pstruct + i * f->size,
                         regions,
                         nregions,
                         walkhandlers,
                         opaque);
            if (rc)
              return rc;

            rc = walkhandlers->endstruct(opaque);
            if (rc)
              return rc;
          }

          rc = walkhandlers->endarray(opaque);
          if (rc)
            return rc;
        }
        break;
      }

    case zttype_structptr:
      {
        const unsigned char **ppstruct = (const unsigned char **) rawvalue;

        if (f->nelems == 1)
        {
          rc = walkhandlers->startstruct(f->name, opaque);
          if (rc)
            return rc;

          rc = zt_walk(f->metadata,
                       *ppstruct,
                       regions,
                       nregions,
                       walkhandlers,
                       opaque);
          if (rc)
            return rc;

          rc = walkhandlers->endstruct(opaque);
          if (rc)
            return rc;
        }
        else
        {
          int j;

          rc = walkhandlers->startarray(f->name, f->nelems, opaque);
          if (rc)
            return rc;

          for (j = 0; j < f->nelems; j++)
          {
            rc = walkhandlers->startstruct(NULL, opaque);
            if (rc)
              return rc;

            rc = zt_walk(f->metadata,
                         *ppstruct++,
                         regions,
                         nregions,
                         walkhandlers,
                         opaque);
            if (rc)
              return rc;

            rc = walkhandlers->endstruct(opaque);
            if (rc)
              return rc;
          }

          rc = walkhandlers->endarray(opaque);
          if (rc)
            return rc;
        }
        break;
      }

    case zttype_staticarrayidx:
      {
        const ztarray_t *array;
        const char      *base;
        const char      *end;
        const char      *pp;
        const char      *ptr;
        unsigned long    index;

        if (f->nelems != 1)
          return ztresult_BAD_FIELD;

        array = f->array;
        base  = array->base;
        end   = (const char *) array->base + array->length;
        pp    = (const char *) structure + f->offset;
        ptr   = *((const char **) pp);

        if (ptr == NULL)
        {
          index = ULONG_MAX;
        }
        else
        {
          if (ptr < base || ptr >= end)
            return ztresult_BAD_POINTER;

          index = (ptr - base) / (array->length / array->nelems);
        }
        rc = walkhandlers->index(f->name, index, opaque);
        if (rc)
          return rc;

        break;
      }

    case zttype_arrayidx:
      {
        int                   r;
        const ztarray_t      *array;
        const char           *base;
        const char           *end;
        const unsigned char **pp;
        const char           *ptr;
        unsigned long         index;

        if (f->nelems != 1)
          return ztresult_BAD_FIELD;

        /* find f->regionid in regions[] */
        for (r = 0; r < nregions; r++)
          if (regions[r].id == f->regionid)
            break;

        if (r == nregions)
          return ztresult_UNKNOWN_REGION;

        /* use the array spec to turn it into an index */
        array = &regions[r].spec;
        base  = array->base;
        end   = (const char *) array->base + array->length;
        pp    = (const unsigned char **) rawvalue;
        ptr   = *((const char **) pp);

        if (ptr == NULL)
        {
          index = ULONG_MAX;
        }
        else
        {
          if (ptr < base || ptr >= end)
            return ztresult_BAD_POINTER;

          index = (ptr - base) / (array->length / array->nelems);
        }
        rc = walkhandlers->index(f->name, index, opaque);
        if (rc)
          return rc;

        break;
      }

    case zttype_version:
      {
        const ztversion_t *pvalue = rawvalue;
        rc = walkhandlers->version(f->name, *pvalue, opaque);
        if (rc)
          return rc;
        break;
      }

    case zttype_custom:
      {
        const void *pvalue = rawvalue;
        rc = walkhandlers->custom(f->name, f->typeidx, pvalue, opaque);
        if (rc)
          return rc;
        break;
      }

    default:
      return ztresult_UNKNOWN_TYPE;
    }
  }

  return ztresult_OK;
}